

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_turn_undead(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  CHAR_DATA *in_RDX;
  int in_ESI;
  __type_conflict2 _Var6;
  CHAR_DATA *follower;
  int num;
  int count;
  int value;
  int dam;
  CHAR_DATA *v_next;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_00003758;
  CHAR_DATA *in_stack_00003760;
  CHAR_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CHAR_DATA *in_stack_ffffffffffffff90;
  ulong uVar7;
  int iVar8;
  int in_stack_ffffffffffffffb4;
  int dam_type;
  CHAR_DATA *pCVar9;
  CHAR_DATA *pCVar10;
  int level_00;
  int local_3c;
  int local_34;
  CHAR_DATA *local_28;
  int local_8;
  
  local_34 = 0;
  pCVar9 = (CHAR_DATA *)0x0;
  local_3c = 0;
  level_00 = 0;
  bVar1 = is_evil(in_stack_ffffffffffffff78);
  local_8 = in_ESI;
  if (bVar1) {
    act((char *)in_stack_ffffffffffffff90,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
        in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    send_to_char((char *)in_stack_ffffffffffffff90,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    act((char *)in_stack_ffffffffffffff90,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
        in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    act((char *)in_stack_ffffffffffffff90,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
        in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    bVar1 = is_good(in_stack_ffffffffffffff78);
    if (!bVar1) {
      local_8 = in_ESI + -3;
    }
  }
  bVar1 = is_evil(in_stack_ffffffffffffff78);
  pCVar10 = char_list;
  if (bVar1) {
    for (; pCVar10 != (CHAR_DATA *)0x0; pCVar10 = pCVar10->next) {
      if (pCVar10->master == in_RDX) {
        in_stack_ffffffffffffff80 = (CHAR_DATA *)pCVar10->act[0];
        _Var6 = std::pow<int,int>(0,0x61bfad);
        if ((((ulong)in_stack_ffffffffffffff80 & (long)_Var6) != 0) && (pCVar10 != in_RDX)) {
          level_00 = level_00 + 1;
          local_3c = pCVar10->level + local_3c;
        }
      }
    }
    pCVar10 = (CHAR_DATA *)0x0;
    pCVar9 = in_RDX->in_room->people;
    while (local_28 = pCVar9, local_28 != (CHAR_DATA *)0x0) {
      pCVar9 = local_28->next_in_room;
      bVar1 = is_same_group(local_28,in_RDX);
      if (!bVar1) {
        ch_00 = (CHAR_DATA *)local_28->act[0];
        _Var6 = std::pow<int,int>(0,0x61c060);
        if ((((ulong)ch_00 & (long)_Var6) != 0) &&
           (bVar1 = is_affected_by((CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20)), !bVar1)) {
          iVar2 = in_RDX->level * 3;
          if ((((SBORROW4(iVar2,local_3c * 2) != iVar2 + local_3c * -2 < 0) ||
               ((in_RDX->level < 0x14 && (0 < level_00)))) ||
              ((in_RDX->level < 0x28 && (1 < level_00)))) ||
             ((((in_RDX->level < 0x33 && (2 < level_00)) ||
               ((int)in_RDX->level < local_28->level + 10)) ||
              ((bVar1 = saves_spell(level_00,pCVar10,in_stack_ffffffffffffffb4), bVar1 ||
               (bVar1 = is_npc(ch_00), !bVar1)))))) {
            act((char *)in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80,ch_00,0);
          }
          else {
            act((char *)in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80,ch_00,0);
            stop_fighting(in_stack_ffffffffffffff80,SUB81((ulong)ch_00 >> 0x38,0));
            local_28->master = in_RDX;
            local_28->leader = in_RDX;
            _Var6 = std::pow<int,int>(0,0x61c1bf);
            local_28->affected_by[0] = (long)_Var6 | local_28->affected_by[0];
            _Var6 = std::pow<int,int>(0,0x61c1e6);
            local_28->act[0] = ((long)_Var6 ^ 0xffffffffffffffffU) & local_28->act[0];
            act((char *)in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80,ch_00,0);
            level_00 = level_00 + 1;
            local_3c = local_28->level + local_3c;
          }
        }
      }
    }
  }
  else {
    pCVar10 = in_RDX->in_room->people;
    while (local_28 = pCVar10, local_28 != (CHAR_DATA *)0x0) {
      pCVar10 = local_28->next_in_room;
      bVar1 = is_same_group(local_28,in_RDX);
      if (!bVar1) {
        uVar7 = local_28->act[0];
        _Var6 = std::pow<int,int>(0,0x61bd5d);
        if ((uVar7 & (long)_Var6) != 0) {
          dam_type = 1;
          iVar2 = (local_8 - local_28->level) + 10;
          piVar5 = std::max<int>((int *)&stack0xffffffffffffffb4,(int *)&stack0xffffffffffffffb0);
          iVar8 = 0xd;
          iVar3 = *piVar5 + -4;
          std::max<int>((int *)&stack0xffffffffffffffac,(int *)&stack0xffffffffffffffa8);
          bVar1 = is_good(in_stack_ffffffffffffff78);
          if (bVar1) {
            local_34 = dice((int)in_stack_ffffffffffffff80,
                            (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
          }
          if (((((local_28->level + 0xf < (int)in_RDX->level) &&
                (bVar1 = is_npc(in_stack_ffffffffffffff78), bVar1)) &&
               (bVar1 = is_good(in_stack_ffffffffffffff78), bVar1)) ||
              ((local_28->level + 0x14 < (int)in_RDX->level &&
               (bVar1 = is_npc(in_stack_ffffffffffffff78), bVar1)))) ||
             ((bVar1 = is_good(in_stack_ffffffffffffff78), bVar1 &&
              ((bVar1 = is_npc(in_stack_ffffffffffffff78), bVar1 &&
               (iVar4 = number_percent(), iVar4 < 5)))))) {
            act((char *)in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
            act((char *)in_stack_ffffffffffffff90,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
            raw_kill(in_stack_00003760,in_stack_00003758);
          }
          else {
            in_stack_ffffffffffffff90 = in_RDX;
            bVar1 = saves_spell(level_00,pCVar9,dam_type);
            in_stack_ffffffffffffff8c = local_34;
            if (bVar1) {
              in_stack_ffffffffffffff8c = local_34 / 2;
            }
            damage_old((CHAR_DATA *)CONCAT44(dam_type,iVar2),(CHAR_DATA *)CONCAT44(iVar8,iVar3),
                       (int)(uVar7 >> 0x20),(int)uVar7,(int)((ulong)local_28 >> 0x20),
                       SUB81((ulong)local_28 >> 0x18,0));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spell_turn_undead(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	CHAR_DATA *v_next;
	int dam = 0;
	int value, count, num;
	CHAR_DATA *follower;

	follower = nullptr; /* follower, count and num used for evil clerics */
	count = 0;
	num = 0;

	if (!is_evil(ch))
	{
		act("$n raises $s hands and calls upon the gods to destroy the unholy.", ch, nullptr, nullptr, TO_ROOM);
		act("You raise your hands and call upon the gods to destroy the unholy.", ch, nullptr, nullptr, TO_CHAR);

		if (!is_good(ch))
			level -= 3;
	}
	else
	{
		act("$n turns $s unholy influence upon the room.", ch, 0, 0, TO_ROOM);
		send_to_char("You turn your unholy influence upon those in the room.\n\r", ch);
	}

	/*
	if (!is_npc(ch) && ch->pcdata->special == SPEC_PALADIN_HUNTER)
		level += number_range(2,level/7);
	*/

	if (!is_evil(ch))
	{
		for (victim = ch->in_room->people; victim != nullptr; victim = v_next)
		{
			v_next = victim->next_in_room;

			if (is_same_group(victim, ch) || !IS_SET(victim->act, ACT_UNDEAD))
				continue;

			value = std::max(1, level - victim->level + 10);
			value = std::max(13, value - 4);

			if (is_good(ch))
				dam = dice(level, value);

			if (((ch->level > (victim->level + 15)) && is_npc(victim) && is_good(ch))
				|| ((ch->level > (victim->level + 20)) && is_npc(victim))
				|| (is_good(ch) && is_npc(victim) && number_percent() < 5))
			{
				act("$N crumbles to dust from the power of $n's turning.", ch, nullptr, victim, TO_ROOM);
				act("$N's body crumbles to dust from the power of your turning.", ch, nullptr, victim, TO_CHAR);
				raw_kill(ch, victim);
			}
			else
			{

				damage_old(ch, victim, saves_spell(level, victim, DAM_HOLY) ? dam / 2 : dam, sn, DAM_HOLY, true);
			}
		}

		return;
	}
	else
	{
		for (follower = char_list; follower != nullptr; follower = follower->next)
		{
			if (follower->master == ch && IS_SET(follower->act, ACT_UNDEAD) && follower != ch)
			{
				num++;
				count += follower->level;
			}
		}

		for (victim = ch->in_room->people; victim != nullptr; victim = v_next)
		{
			v_next = victim->next_in_room;

			if (is_same_group(victim, ch) || !IS_SET(victim->act, ACT_UNDEAD))
				continue;

			if (is_affected_by(victim, AFF_CHARM))
				continue;

			if ((ch->level * 3 < count * 2)
				|| (ch->level < 20 && num > 0)
				|| (ch->level < 40 && num > 1)
				|| (ch->level < 51 && num > 2)
				|| (ch->level < (victim->level + 10))
				|| saves_spell(ch->level, victim, DAM_OTHER)
				|| !is_npc(victim))
			{
				act("You attempt to control $N but do not have the influence.", ch, 0, victim, TO_CHAR);
				continue;
			}
			else
			{
				act("$n stares in hatred for a moment then suddenly becomes very subdued.", victim, 0, 0, TO_NOTVICT);
				stop_fighting(victim, true);

				victim->master = ch;
				victim->leader = ch;

				SET_BIT(victim->affected_by, AFF_CHARM);
				REMOVE_BIT(victim->act, ACT_AGGRESSIVE);

				act("$N now follows you.", ch, 0, victim, TO_CHAR);

				num++;
				count += victim->level;
			}
		}
	}
}